

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint *z;
  ulong uVar12;
  int iVar13;
  undefined1 local_68;
  uint local_67;
  undefined1 local_63;
  char local_62;
  char local_61;
  undefined1 local_60;
  char local_5f;
  char local_5e;
  undefined1 local_5d;
  char local_5c;
  char local_5b;
  undefined1 local_5a;
  char local_59;
  char local_58;
  undefined1 local_57;
  char local_56;
  char local_55;
  undefined1 local_54;
  char local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  DateTime x;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  z = (uint *)&local_68;
  iVar10 = isDate(context,argc,argv,&x);
  if (iVar10 == 0) {
    computeYMD_HMS(&x);
    uVar9 = -x.Y;
    if (0 < x.Y) {
      uVar9 = x.Y;
    }
    uVar12 = (ulong)uVar9;
    uVar1 = (uVar12 / 10) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar12 / 1000) % 10;
    uVar8 = (ushort)uVar3;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar1;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)(uVar12 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar12 % 10) - (0xff < uVar8);
    local_67 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                        CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                 CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                          (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))))
               | (uint)DAT_001a95a0;
    local_63 = 0x2d;
    local_62 = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                            (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    local_61 = (char)(x.M % 10) + '0';
    local_60 = 0x2d;
    local_5f = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                            (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    local_5e = (char)(x.D % 10) + '0';
    local_5d = 0x20;
    local_5c = (char)((long)((ulong)(uint)((int)((long)x.h / 10) >> 0x1f) << 0x20 |
                            (long)x.h / 10 & 0xffffffffU) % 10) + '0';
    local_5b = (char)(x.h % 10) + '0';
    local_5a = 0x3a;
    local_59 = (char)((long)((ulong)(uint)((int)((long)x.m / 10) >> 0x1f) << 0x20 |
                            (long)x.m / 10 & 0xffffffffU) % 10) + '0';
    local_58 = (char)(x.m % 10) + '0';
    local_57 = 0x3a;
    if ((x._44_1_ & 4) == 0) {
      iVar11 = (int)x.s;
      iVar10 = iVar11 / 10;
      iVar13 = 0x14;
      local_54 = 0;
    }
    else {
      iVar13 = (int)(x.s * 1000.0 + 0.5);
      iVar10 = iVar13 / 10000;
      iVar11 = iVar13 / 1000;
      local_53 = (char)((long)((ulong)(uint)((int)((long)iVar13 / 100) >> 0x1f) << 0x20 |
                              (long)iVar13 / 100 & 0xffffffffU) % 10) + '0';
      local_52 = (char)((long)((ulong)(uint)((int)((long)iVar13 / 10) >> 0x1f) << 0x20 |
                              (long)iVar13 / 10 & 0xffffffffU) % 10) + '0';
      local_51 = (char)(iVar13 % 10) + '0';
      local_50 = 0;
      iVar13 = 0x18;
      local_54 = 0x2e;
    }
    local_55 = (char)(iVar11 % 10) + '0';
    local_56 = (char)(iVar10 % 10) + '0';
    if (x.Y < 0) {
      local_68 = 0x2d;
    }
    else {
      z = &local_67;
      iVar13 = iVar13 + -1;
    }
    sqlite3_result_text(context,(char *)z,iVar13,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}